

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O3

QString * __thiscall
RichHdrWrapper::getFieldName(QString *__return_storage_ptr__,RichHdrWrapper *this,size_t fieldId)

{
  size_t sVar1;
  storage_type *psVar2;
  char *ch;
  QByteArrayView QVar3;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  if ((this->richSign == (RICH_SIGNATURE *)0x0) || (this->dansHdr == (RICH_DANS_HEADER *)0x0)) {
    psVar2 = (storage_type *)0x0;
  }
  else if (fieldId - 1 < 3) {
    psVar2 = (storage_type *)0x12;
  }
  else {
    if (((fieldId != 0) && (sVar1 = this->compIdCounter, sVar1 + 3 < fieldId)) &&
       (sVar1 + 4 != fieldId)) {
      if (sVar1 + 5 == fieldId) {
        ch = "Checksum";
      }
      else {
        ch = "";
      }
      QString::QString(__return_storage_ptr__,ch);
      return __return_storage_ptr__;
    }
    psVar2 = (storage_type *)0x7;
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString RichHdrWrapper::getFieldName(size_t fieldId)
{
    if (!this->richSign || !this->dansHdr) {
        return "";
    }
    const size_t cnt = this->compIdCounter - 1;

    switch (fieldId) {
         case DANS_ID: return("DanS ID");
         case CPAD0: case CPAD1: case CPAD2:  return ("Checksumed padding");
    }
    if (fieldId >= COMP_ID_1 && fieldId <= COMP_ID_1 + cnt)
    {
        return("Comp ID");
    }
    if (fieldId == RICH_ID + cnt) return("Rich ID");
    if (fieldId == CHECKSUM + cnt) return("Checksum");
    return "";
}